

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib557.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  
  us_test[1].num = 0xffff;
  us_test[1].expected = "65535";
  us_test[2].num = 0xff00;
  us_test[2].expected = "65280";
  us_test[3].num = 0xff;
  us_test[3].expected = "255";
  us_test[4].num = 0xf000;
  us_test[4].expected = "61440";
  us_test[5].num = 0xf00;
  us_test[5].expected = "3840";
  us_test[6].num = 0xf0;
  us_test[6].expected = "240";
  us_test[7].num = 0xf;
  us_test[7].expected = "15";
  us_test[8].num = 0xc000;
  us_test[8].expected = "49152";
  us_test[9].num = 0xc00;
  us_test[9].expected = "3072";
  us_test[10].num = 0xc0;
  us_test[10].expected = "192";
  us_test[0xb].num = 0xc;
  us_test[0xb].expected = "12";
  us_test[0xc].num = 1;
  us_test[0xc].expected = "1";
  us_test[0xd].num = 0;
  us_test[0xd].expected = "0";
  lVar6 = 0x1061b0;
  local_54 = 0;
  for (uVar5 = 1; uVar5 != 0xe; uVar5 = uVar5 + 1) {
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      *(undefined1 *)(lVar6 + lVar3) = 0x58;
    }
    pcVar8 = us_test[uVar5].result;
    us_test[uVar5].result[0xff] = '\0';
    curl_msprintf(pcVar8,"%hu",us_test[uVar5].num);
    pcVar7 = us_test[uVar5].expected;
    sVar4 = strlen(pcVar7);
    iVar1 = bcmp(pcVar8,pcVar7,sVar4);
    if (iVar1 != 0) {
      printf("unsigned short test #%.2d: Failed (Expected: %s Got: %s)\n",uVar5 & 0xffffffff,pcVar7,
             pcVar8);
      local_54 = local_54 + 1;
    }
    lVar6 = lVar6 + 0x110;
  }
  pcVar7 = "Some curl_mprintf() unsigned short tests Failed!";
  if (local_54 == 0) {
    pcVar7 = "All curl_mprintf() unsigned short tests OK!";
  }
  puts(pcVar7);
  ss_test[1].num = 0x7fff;
  ss_test[1].expected = "32767";
  ss_test[2].num = 0x7ffe;
  ss_test[2].expected = "32766";
  ss_test[3].num = 0x7ffd;
  ss_test[3].expected = "32765";
  ss_test[4].num = 0x7f00;
  ss_test[4].expected = "32512";
  ss_test[5].num = 0x7f0;
  ss_test[5].expected = "2032";
  ss_test[6].num = 0x7f;
  ss_test[6].expected = "127";
  ss_test[7].num = 0x7000;
  ss_test[7].expected = "28672";
  ss_test[8].num = 0x700;
  ss_test[8].expected = "1792";
  ss_test[9].num = 0x70;
  ss_test[9].expected = "112";
  ss_test[10].num = 7;
  ss_test[10].expected = "7";
  ss_test[0xb].num = 0x5000;
  ss_test[0xb].expected = "20480";
  ss_test[0xc].num = 0x500;
  ss_test[0xc].expected = "1280";
  ss_test[0xd].num = 0x50;
  ss_test[0xd].expected = "80";
  ss_test[0xe].num = 5;
  ss_test[0xe].expected = "5";
  ss_test[0xf].num = 1;
  ss_test[0xf].expected = "1";
  ss_test[0x10].num = 0;
  ss_test[0x10].expected = "0";
  ss_test[0x11].num = -0x8000;
  ss_test[0x11].expected = "-32768";
  ss_test[0x12].num = -0x7fff;
  ss_test[0x12].expected = "-32767";
  ss_test[0x13].num = -0x7ffe;
  ss_test[0x13].expected = "-32766";
  ss_test[0x14].num = -0x7f01;
  ss_test[0x14].expected = "-32513";
  ss_test[0x15].num = -0x7f1;
  ss_test[0x15].expected = "-2033";
  ss_test[0x16].num = -0x80;
  ss_test[0x16].expected = "-128";
  ss_test[0x17].num = -0x7001;
  ss_test[0x17].expected = "-28673";
  ss_test[0x18].num = -0x701;
  ss_test[0x18].expected = "-1793";
  ss_test[0x19].num = -0x71;
  ss_test[0x19].expected = "-113";
  ss_test[0x1a].num = -8;
  ss_test[0x1a].expected = "-8";
  ss_test[0x1b].num = -0x5001;
  ss_test[0x1b].expected = "-20481";
  ss_test[0x1c].num = -0x501;
  ss_test[0x1c].expected = "-1281";
  ss_test[0x1d].num = -0x51;
  ss_test[0x1d].expected = "-81";
  ss_test[0x1e].num = -6;
  ss_test[0x1e].expected = "-6";
  ss_test[0x1f].num = -1;
  ss_test[0x1f].expected = "-1";
  lVar6 = 0x10cd00;
  local_58 = 0;
  for (uVar5 = 1; uVar5 != 0x20; uVar5 = uVar5 + 1) {
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      *(undefined1 *)(lVar6 + lVar3) = 0x58;
    }
    pcVar8 = ss_test[uVar5].result;
    ss_test[uVar5].result[0xff] = '\0';
    curl_msprintf(pcVar8,"%hd",(int)ss_test[uVar5].num);
    pcVar7 = ss_test[uVar5].expected;
    sVar4 = strlen(pcVar7);
    iVar1 = bcmp(pcVar8,pcVar7,sVar4);
    if (iVar1 != 0) {
      printf("signed short test #%.2d: Failed (Expected: %s Got: %s)\n",uVar5 & 0xffffffff,pcVar7,
             pcVar8);
      local_58 = local_58 + 1;
    }
    lVar6 = lVar6 + 0x110;
  }
  pcVar7 = "Some curl_mprintf() signed short tests Failed!";
  if (local_58 == 0) {
    pcVar7 = "All curl_mprintf() signed short tests OK!";
  }
  puts(pcVar7);
  ui_test[1].num = 0xffffffff;
  ui_test[1].expected = "4294967295";
  ui_test[2].num = 0xffff0000;
  ui_test[2].expected = "4294901760";
  ui_test[3].num = 0xffff;
  ui_test[3].expected = "65535";
  ui_test[4].num = 0xff000000;
  ui_test[4].expected = "4278190080";
  ui_test[5].num = 0xff0000;
  ui_test[5].expected = "16711680";
  ui_test[6].num = 0xff00;
  ui_test[6].expected = "65280";
  ui_test[7].num = 0xff;
  ui_test[7].expected = "255";
  ui_test[8].num = 0xf0000000;
  ui_test[8].expected = "4026531840";
  ui_test[9].num = 0xf000000;
  ui_test[9].expected = "251658240";
  ui_test[10].num = 0xf00000;
  ui_test[10].expected = "15728640";
  ui_test[0xb].num = 0xf0000;
  ui_test[0xb].expected = "983040";
  ui_test[0xc].num = 0xf000;
  ui_test[0xc].expected = "61440";
  ui_test[0xd].num = 0xf00;
  ui_test[0xd].expected = "3840";
  ui_test[0xe].num = 0xf0;
  ui_test[0xe].expected = "240";
  ui_test[0xf].num = 0xf;
  ui_test[0xf].expected = "15";
  ui_test[0x10].num = 0xc0000000;
  ui_test[0x10].expected = "3221225472";
  ui_test[0x11].num = 0xc000000;
  ui_test[0x11].expected = "201326592";
  ui_test[0x12].num = 0xc00000;
  ui_test[0x12].expected = "12582912";
  ui_test[0x13].num = 0xc0000;
  ui_test[0x13].expected = "786432";
  ui_test[0x14].num = 0xc000;
  ui_test[0x14].expected = "49152";
  ui_test[0x15].num = 0xc00;
  ui_test[0x15].expected = "3072";
  ui_test[0x16].num = 0xc0;
  ui_test[0x16].expected = "192";
  ui_test[0x17].num = 0xc;
  ui_test[0x17].expected = "12";
  ui_test[0x18].num = 1;
  ui_test[0x18].expected = "1";
  ui_test[0x19].num = 0;
  ui_test[0x19].expected = "0";
  lVar6 = 0x113850;
  local_5c = 0;
  for (uVar5 = 1; uVar5 != 0x1a; uVar5 = uVar5 + 1) {
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      *(undefined1 *)(lVar6 + lVar3) = 0x58;
    }
    pcVar8 = ui_test[uVar5].result;
    ui_test[uVar5].result[0xff] = '\0';
    curl_msprintf(pcVar8,"%u",ui_test[uVar5].num);
    pcVar7 = ui_test[uVar5].expected;
    sVar4 = strlen(pcVar7);
    iVar1 = bcmp(pcVar8,pcVar7,sVar4);
    if (iVar1 != 0) {
      printf("unsigned int test #%.2d: Failed (Expected: %s Got: %s)\n",uVar5 & 0xffffffff,pcVar7,
             pcVar8);
      local_5c = local_5c + 1;
    }
    lVar6 = lVar6 + 0x110;
  }
  pcVar7 = "Some curl_mprintf() unsigned int tests Failed!";
  if (local_5c == 0) {
    pcVar7 = "All curl_mprintf() unsigned int tests OK!";
  }
  puts(pcVar7);
  si_test[1].num = 0x7fffffff;
  si_test[1].expected = "2147483647";
  si_test[2].num = 0x7ffffffe;
  si_test[2].expected = "2147483646";
  si_test[3].num = 0x7ffffffd;
  si_test[3].expected = "2147483645";
  si_test[4].num = 0x7fff0000;
  si_test[4].expected = "2147418112";
  si_test[5].num = 0x7fff;
  si_test[5].expected = "32767";
  si_test[6].num = 0x7f000000;
  si_test[6].expected = "2130706432";
  si_test[7].num = 0x7f0000;
  si_test[7].expected = "8323072";
  si_test[8].num = 0x7f00;
  si_test[8].expected = "32512";
  si_test[9].num = 0x7f;
  si_test[9].expected = "127";
  si_test[10].num = 0x70000000;
  si_test[10].expected = "1879048192";
  si_test[0xb].num = 0x7000000;
  si_test[0xb].expected = "117440512";
  si_test[0xc].num = 0x700000;
  si_test[0xc].expected = "7340032";
  si_test[0xd].num = 0x70000;
  si_test[0xd].expected = "458752";
  si_test[0xe].num = 0x7000;
  si_test[0xe].expected = "28672";
  si_test[0xf].num = 0x700;
  si_test[0xf].expected = "1792";
  si_test[0x10].num = 0x70;
  si_test[0x10].expected = "112";
  si_test[0x11].num = 7;
  si_test[0x11].expected = "7";
  si_test[0x12].num = 0x50000000;
  si_test[0x12].expected = "1342177280";
  si_test[0x13].num = 0x5000000;
  si_test[0x13].expected = "83886080";
  si_test[0x14].num = 0x500000;
  si_test[0x14].expected = "5242880";
  si_test[0x15].num = 0x50000;
  si_test[0x15].expected = "327680";
  si_test[0x16].num = 0x5000;
  si_test[0x16].expected = "20480";
  si_test[0x17].num = 0x500;
  si_test[0x17].expected = "1280";
  si_test[0x18].num = 0x50;
  si_test[0x18].expected = "80";
  si_test[0x19].num = 5;
  si_test[0x19].expected = "5";
  si_test[0x1a].num = 1;
  si_test[0x1a].expected = "1";
  si_test[0x1b].num = 0;
  si_test[0x1b].expected = "0";
  si_test[0x1c].num = -0x80000000;
  si_test[0x1c].expected = "-2147483648";
  si_test[0x1d].num = -0x7fffffff;
  si_test[0x1d].expected = "-2147483647";
  si_test[0x1e].num = -0x7ffffffe;
  si_test[0x1e].expected = "-2147483646";
  si_test[0x1f].num = -0x7fff0001;
  si_test[0x1f].expected = "-2147418113";
  si_test[0x20].num = -0x8000;
  si_test[0x20].expected = "-32768";
  si_test[0x21].num = -0x7f000001;
  si_test[0x21].expected = "-2130706433";
  si_test[0x22].num = -0x7f0001;
  si_test[0x22].expected = "-8323073";
  si_test[0x23].num = -0x7f01;
  si_test[0x23].expected = "-32513";
  si_test[0x24].num = -0x80;
  si_test[0x24].expected = "-128";
  si_test[0x25].num = -0x70000001;
  si_test[0x25].expected = "-1879048193";
  si_test[0x26].num = -0x7000001;
  si_test[0x26].expected = "-117440513";
  si_test[0x27].num = -0x700001;
  si_test[0x27].expected = "-7340033";
  si_test[0x28].num = -0x70001;
  si_test[0x28].expected = "-458753";
  si_test[0x29].num = -0x7001;
  si_test[0x29].expected = "-28673";
  si_test[0x2a].num = -0x701;
  si_test[0x2a].expected = "-1793";
  si_test[0x2b].num = -0x71;
  si_test[0x2b].expected = "-113";
  si_test[0x2c].num = -8;
  si_test[0x2c].expected = "-8";
  si_test[0x2d].num = -0x50000001;
  si_test[0x2d].expected = "-1342177281";
  si_test[0x2e].num = -0x5000001;
  si_test[0x2e].expected = "-83886081";
  si_test[0x2f].num = -0x500001;
  si_test[0x2f].expected = "-5242881";
  si_test[0x30].num = -0x50001;
  si_test[0x30].expected = "-327681";
  si_test[0x31].num = -0x5001;
  si_test[0x31].expected = "-20481";
  si_test[0x32].num = -0x501;
  si_test[0x32].expected = "-1281";
  si_test[0x33].num = -0x51;
  si_test[0x33].expected = "-81";
  si_test[0x34].num = -6;
  si_test[0x34].expected = "-6";
  si_test[0x35].num = -1;
  si_test[0x35].expected = "-1";
  lVar6 = 0x11a3a0;
  local_60 = 0;
  for (uVar5 = 1; uVar5 != 0x36; uVar5 = uVar5 + 1) {
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      *(undefined1 *)(lVar6 + lVar3) = 0x58;
    }
    pcVar8 = si_test[uVar5].result;
    si_test[uVar5].result[0xff] = '\0';
    curl_msprintf(pcVar8,"%d",si_test[uVar5].num);
    pcVar7 = si_test[uVar5].expected;
    sVar4 = strlen(pcVar7);
    iVar1 = bcmp(pcVar8,pcVar7,sVar4);
    if (iVar1 != 0) {
      printf("signed int test #%.2d: Failed (Expected: %s Got: %s)\n",uVar5 & 0xffffffff,pcVar7,
             pcVar8);
      local_60 = local_60 + 1;
    }
    lVar6 = lVar6 + 0x110;
  }
  pcVar7 = "Some curl_mprintf() signed int tests Failed!";
  if (local_60 == 0) {
    pcVar7 = "All curl_mprintf() signed int tests OK!";
  }
  puts(pcVar7);
  ul_test[1].num = 0xffffffffffffffff;
  ul_test[1].expected = "18446744073709551615";
  ul_test[2].num = 0xffffffff00000000;
  ul_test[2].expected = "18446744069414584320";
  ul_test[3].num = 0xffffffff;
  ul_test[3].expected = "4294967295";
  ul_test[4].num = 0xffff000000000000;
  ul_test[4].expected = "18446462598732840960";
  ul_test[5].num = 0xffff00000000;
  ul_test[5].expected = "281470681743360";
  ul_test[6].num = 0xffff0000;
  ul_test[6].expected = "4294901760";
  ul_test[7].num = 0xffff;
  ul_test[7].expected = "65535";
  ul_test[8].num = 0xff00000000000000;
  ul_test[8].expected = "18374686479671623680";
  ul_test[9].num = 0xff000000000000;
  ul_test[9].expected = "71776119061217280";
  ul_test[10].num = 0xff0000000000;
  ul_test[10].expected = "280375465082880";
  ul_test[0xb].num = 0xff00000000;
  ul_test[0xb].expected = "1095216660480";
  ul_test[0xc].num = 0xff000000;
  ul_test[0xc].expected = "4278190080";
  ul_test[0xd].num = 0xff0000;
  ul_test[0xd].expected = "16711680";
  ul_test[0xe].num = 0xff00;
  ul_test[0xe].expected = "65280";
  ul_test[0xf].num = 0xff;
  ul_test[0xf].expected = "255";
  ul_test[0x10].num = 0xf000000000000000;
  ul_test[0x10].expected = "17293822569102704640";
  ul_test[0x11].num = 0xf00000000000000;
  ul_test[0x11].expected = "1080863910568919040";
  ul_test[0x12].num = 0xf0000000000000;
  ul_test[0x12].expected = "67553994410557440";
  ul_test[0x13].num = 0xf000000000000;
  ul_test[0x13].expected = "4222124650659840";
  ul_test[0x14].num = 0xf00000000000;
  ul_test[0x14].expected = "263882790666240";
  ul_test[0x15].num = 0xf0000000000;
  ul_test[0x15].expected = "16492674416640";
  ul_test[0x16].num = 0xf000000000;
  ul_test[0x16].expected = "1030792151040";
  ul_test[0x17].num = 0xf00000000;
  ul_test[0x17].expected = "64424509440";
  ul_test[0x18].num = 0xf0000000;
  ul_test[0x18].expected = "4026531840";
  ul_test[0x19].num = 0xf000000;
  ul_test[0x19].expected = "251658240";
  ul_test[0x1a].num = 0xf00000;
  ul_test[0x1a].expected = "15728640";
  ul_test[0x1b].num = 0xf0000;
  ul_test[0x1b].expected = "983040";
  ul_test[0x1c].num = 0xf000;
  ul_test[0x1c].expected = "61440";
  ul_test[0x1d].num = 0xf00;
  ul_test[0x1d].expected = "3840";
  ul_test[0x1e].num = 0xf0;
  ul_test[0x1e].expected = "240";
  ul_test[0x1f].num = 0xf;
  ul_test[0x1f].expected = "15";
  ul_test[0x20].num = 0xc000000000000000;
  ul_test[0x20].expected = "13835058055282163712";
  ul_test[0x21].num = 0xc00000000000000;
  ul_test[0x21].expected = "864691128455135232";
  ul_test[0x22].num = 0xc0000000000000;
  ul_test[0x22].expected = "54043195528445952";
  ul_test[0x23].num = 0xc000000000000;
  ul_test[0x23].expected = "3377699720527872";
  ul_test[0x24].num = 0xc00000000000;
  ul_test[0x24].expected = "211106232532992";
  ul_test[0x25].num = 0xc0000000000;
  ul_test[0x25].expected = "13194139533312";
  ul_test[0x26].num = 0xc000000000;
  ul_test[0x26].expected = "824633720832";
  ul_test[0x27].num = 0xc00000000;
  ul_test[0x27].expected = "51539607552";
  ul_test[0x28].num = 0xc0000000;
  ul_test[0x28].expected = "3221225472";
  ul_test[0x29].num = 0xc000000;
  ul_test[0x29].expected = "201326592";
  ul_test[0x2a].num = 0xc00000;
  ul_test[0x2a].expected = "12582912";
  ul_test[0x2b].num = 0xc0000;
  ul_test[0x2b].expected = "786432";
  ul_test[0x2c].num = 0xc000;
  ul_test[0x2c].expected = "49152";
  ul_test[0x2d].num = 0xc00;
  ul_test[0x2d].expected = "3072";
  ul_test[0x2e].num = 0xc0;
  ul_test[0x2e].expected = "192";
  ul_test[0x2f].num = 0xc;
  ul_test[0x2f].expected = "12";
  ul_test[0x30].num = 1;
  ul_test[0x30].expected = "1";
  ul_test[0x31].num = 0;
  ul_test[0x31].expected = "0";
  lVar6 = 0x120ef0;
  local_64 = 0;
  for (uVar5 = 1; uVar5 != 0x32; uVar5 = uVar5 + 1) {
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      *(undefined1 *)(lVar6 + lVar3) = 0x58;
    }
    pcVar8 = ul_test[uVar5].result;
    ul_test[uVar5].result[0xff] = '\0';
    curl_msprintf(pcVar8,"%lu",ul_test[uVar5].num);
    pcVar7 = ul_test[uVar5].expected;
    sVar4 = strlen(pcVar7);
    iVar1 = bcmp(pcVar8,pcVar7,sVar4);
    if (iVar1 != 0) {
      printf("unsigned long test #%.2d: Failed (Expected: %s Got: %s)\n",uVar5 & 0xffffffff,pcVar7,
             pcVar8);
      local_64 = local_64 + 1;
    }
    lVar6 = lVar6 + 0x110;
  }
  pcVar7 = "Some curl_mprintf() unsigned long tests Failed!";
  if (local_64 == 0) {
    pcVar7 = "All curl_mprintf() unsigned long tests OK!";
  }
  puts(pcVar7);
  sl_test[1].num = 0x7fffffffffffffff;
  sl_test[1].expected = "9223372036854775807";
  sl_test[2].num = 0x7ffffffffffffffe;
  sl_test[2].expected = "9223372036854775806";
  sl_test[3].num = 0x7ffffffffffffffd;
  sl_test[3].expected = "9223372036854775805";
  sl_test[4].num = 0x7fffffff00000000;
  sl_test[4].expected = "9223372032559808512";
  sl_test[5].num = 0x7fffffff;
  sl_test[5].expected = "2147483647";
  sl_test[6].num = 0x7fff000000000000;
  sl_test[6].expected = "9223090561878065152";
  sl_test[7].num = 0x7fff00000000;
  sl_test[7].expected = "140733193388032";
  sl_test[8].num = 0x7fff0000;
  sl_test[8].expected = "2147418112";
  sl_test[9].num = 0x7fff;
  sl_test[9].expected = "32767";
  sl_test[10].num = 0x7f00000000000000;
  sl_test[10].expected = "9151314442816847872";
  sl_test[0xb].num = 0x7f000000000000;
  sl_test[0xb].expected = "35747322042253312";
  sl_test[0xc].num = 0x7f0000000000;
  sl_test[0xc].expected = "139637976727552";
  sl_test[0xd].num = 0x7f00000000;
  sl_test[0xd].expected = "545460846592";
  sl_test[0xe].num = 0x7f000000;
  sl_test[0xe].expected = "2130706432";
  sl_test[0xf].num = 0x7f0000;
  sl_test[0xf].expected = "8323072";
  sl_test[0x10].num = 0x7f00;
  sl_test[0x10].expected = "32512";
  sl_test[0x11].num = 0x7f;
  sl_test[0x11].expected = "127";
  sl_test[0x12].num = 0x7000000000000000;
  sl_test[0x12].expected = "8070450532247928832";
  sl_test[0x13].num = 0x700000000000000;
  sl_test[0x13].expected = "504403158265495552";
  sl_test[0x14].num = 0x70000000000000;
  sl_test[0x14].expected = "31525197391593472";
  sl_test[0x15].num = 0x7000000000000;
  sl_test[0x15].expected = "1970324836974592";
  sl_test[0x16].num = 0x700000000000;
  sl_test[0x16].expected = "123145302310912";
  sl_test[0x17].num = 0x70000000000;
  sl_test[0x17].expected = "7696581394432";
  sl_test[0x18].num = 0x7000000000;
  sl_test[0x18].expected = "481036337152";
  sl_test[0x19].num = 0x700000000;
  sl_test[0x19].expected = "30064771072";
  sl_test[0x1a].num = 0x70000000;
  sl_test[0x1a].expected = "1879048192";
  sl_test[0x1b].num = 0x7000000;
  sl_test[0x1b].expected = "117440512";
  sl_test[0x1c].num = 0x700000;
  sl_test[0x1c].expected = "7340032";
  sl_test[0x1d].num = 0x70000;
  sl_test[0x1d].expected = "458752";
  sl_test[0x1e].num = 0x7000;
  sl_test[0x1e].expected = "28672";
  sl_test[0x1f].num = 0x700;
  sl_test[0x1f].expected = "1792";
  sl_test[0x20].num = 0x70;
  sl_test[0x20].expected = "112";
  sl_test[0x21].num = 7;
  sl_test[0x21].expected = "7";
  sl_test[0x22].num = 1;
  sl_test[0x22].expected = "1";
  sl_test[0x23].num = 0;
  sl_test[0x23].expected = "0";
  sl_test[0x24].num = -0x8000000000000000;
  sl_test[0x24].expected = "-9223372036854775808";
  sl_test[0x25].num = -0x7fffffffffffffff;
  sl_test[0x25].expected = "-9223372036854775807";
  sl_test[0x26].num = -0x7ffffffffffffffe;
  sl_test[0x26].expected = "-9223372036854775806";
  sl_test[0x27].num = -0x7fffffff00000001;
  sl_test[0x27].expected = "-9223372032559808513";
  sl_test[0x28].num = -0x80000000;
  sl_test[0x28].expected = "-2147483648";
  sl_test[0x29].num = -0x7fff000000000001;
  sl_test[0x29].expected = "-9223090561878065153";
  sl_test[0x2a].num = -0x7fff00000001;
  sl_test[0x2a].expected = "-140733193388033";
  sl_test[0x2b].num = -0x7fff0001;
  sl_test[0x2b].expected = "-2147418113";
  sl_test[0x2c].num = -0x8000;
  sl_test[0x2c].expected = "-32768";
  sl_test[0x2d].num = -0x7f00000000000001;
  sl_test[0x2d].expected = "-9151314442816847873";
  sl_test[0x2e].num = -0x7f000000000001;
  sl_test[0x2e].expected = "-35747322042253313";
  sl_test[0x2f].num = -0x7f0000000001;
  sl_test[0x2f].expected = "-139637976727553";
  sl_test[0x30].num = -0x7f00000001;
  sl_test[0x30].expected = "-545460846593";
  sl_test[0x31].num = -0x7f000001;
  sl_test[0x31].expected = "-2130706433";
  sl_test[0x32].num = -0x7f0001;
  sl_test[0x32].expected = "-8323073";
  sl_test[0x33].num = -0x7f01;
  sl_test[0x33].expected = "-32513";
  sl_test[0x34].num = -0x80;
  sl_test[0x34].expected = "-128";
  sl_test[0x35].num = -0x7000000000000001;
  sl_test[0x35].expected = "-8070450532247928833";
  sl_test[0x36].num = -0x700000000000001;
  sl_test[0x36].expected = "-504403158265495553";
  sl_test[0x37].num = -0x70000000000001;
  sl_test[0x37].expected = "-31525197391593473";
  sl_test[0x38].num = -0x7000000000001;
  sl_test[0x38].expected = "-1970324836974593";
  sl_test[0x39].num = -0x700000000001;
  sl_test[0x39].expected = "-123145302310913";
  sl_test[0x3a].num = -0x70000000001;
  sl_test[0x3a].expected = "-7696581394433";
  sl_test[0x3b].num = -0x7000000001;
  sl_test[0x3b].expected = "-481036337153";
  sl_test[0x3c].num = -0x700000001;
  sl_test[0x3c].expected = "-30064771073";
  sl_test[0x3d].num = -0x70000001;
  sl_test[0x3d].expected = "-1879048193";
  sl_test[0x3e].num = -0x7000001;
  sl_test[0x3e].expected = "-117440513";
  sl_test[0x3f].num = -0x700001;
  sl_test[0x3f].expected = "-7340033";
  sl_test[0x40].num = -0x70001;
  sl_test[0x40].expected = "-458753";
  sl_test[0x41].num = -0x7001;
  sl_test[0x41].expected = "-28673";
  sl_test[0x42].num = -0x701;
  sl_test[0x42].expected = "-1793";
  sl_test[0x43].num = -0x71;
  sl_test[0x43].expected = "-113";
  sl_test[0x44].num = -8;
  sl_test[0x44].expected = "-8";
  sl_test[0x45].num = -1;
  sl_test[0x45].expected = "-1";
  lVar6 = 0x127a40;
  local_68 = 0;
  for (uVar5 = 1; uVar5 != 0x46; uVar5 = uVar5 + 1) {
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      *(undefined1 *)(lVar6 + lVar3) = 0x58;
    }
    pcVar8 = sl_test[uVar5].result;
    sl_test[uVar5].result[0xff] = '\0';
    curl_msprintf(pcVar8,"%ld",sl_test[uVar5].num);
    pcVar7 = sl_test[uVar5].expected;
    sVar4 = strlen(pcVar7);
    iVar1 = bcmp(pcVar8,pcVar7,sVar4);
    if (iVar1 != 0) {
      printf("signed long test #%.2d: Failed (Expected: %s Got: %s)\n",uVar5 & 0xffffffff,pcVar7,
             pcVar8);
      local_68 = local_68 + 1;
    }
    lVar6 = lVar6 + 0x110;
  }
  pcVar7 = "Some curl_mprintf() signed long tests Failed!";
  if (local_68 == 0) {
    pcVar7 = "All curl_mprintf() signed long tests OK!";
  }
  puts(pcVar7);
  co_test[1].num = 0x7fffffffffffffff;
  co_test[1].expected = "9223372036854775807";
  co_test[2].num = 0x7ffffffffffffffe;
  co_test[2].expected = "9223372036854775806";
  co_test[3].num = 0x7ffffffffffffffd;
  co_test[3].expected = "9223372036854775805";
  co_test[4].num = 0x7fffffff00000000;
  co_test[4].expected = "9223372032559808512";
  co_test[5].num = 0x7fffffff;
  co_test[5].expected = "2147483647";
  co_test[6].num = 0x7fff000000000000;
  co_test[6].expected = "9223090561878065152";
  co_test[7].num = 0x7fff00000000;
  co_test[7].expected = "140733193388032";
  co_test[8].num = 0x7fff0000;
  co_test[8].expected = "2147418112";
  co_test[9].num = 0x7fff;
  co_test[9].expected = "32767";
  co_test[10].num = 0x7f00000000000000;
  co_test[10].expected = "9151314442816847872";
  co_test[0xb].num = 0x7f000000000000;
  co_test[0xb].expected = "35747322042253312";
  co_test[0xc].num = 0x7f0000000000;
  co_test[0xc].expected = "139637976727552";
  co_test[0xd].num = 0x7f00000000;
  co_test[0xd].expected = "545460846592";
  co_test[0xe].num = 0x7f000000;
  co_test[0xe].expected = "2130706432";
  co_test[0xf].num = 0x7f0000;
  co_test[0xf].expected = "8323072";
  co_test[0x10].num = 0x7f00;
  co_test[0x10].expected = "32512";
  co_test[0x11].num = 0x7f;
  co_test[0x11].expected = "127";
  co_test[0x12].num = 0x7000000000000000;
  co_test[0x12].expected = "8070450532247928832";
  co_test[0x13].num = 0x700000000000000;
  co_test[0x13].expected = "504403158265495552";
  co_test[0x14].num = 0x70000000000000;
  co_test[0x14].expected = "31525197391593472";
  co_test[0x15].num = 0x7000000000000;
  co_test[0x15].expected = "1970324836974592";
  co_test[0x16].num = 0x700000000000;
  co_test[0x16].expected = "123145302310912";
  co_test[0x17].num = 0x70000000000;
  co_test[0x17].expected = "7696581394432";
  co_test[0x18].num = 0x7000000000;
  co_test[0x18].expected = "481036337152";
  co_test[0x19].num = 0x700000000;
  co_test[0x19].expected = "30064771072";
  co_test[0x1a].num = 0x70000000;
  co_test[0x1a].expected = "1879048192";
  co_test[0x1b].num = 0x7000000;
  co_test[0x1b].expected = "117440512";
  co_test[0x1c].num = 0x700000;
  co_test[0x1c].expected = "7340032";
  co_test[0x1d].num = 0x70000;
  co_test[0x1d].expected = "458752";
  co_test[0x1e].num = 0x7000;
  co_test[0x1e].expected = "28672";
  co_test[0x1f].num = 0x700;
  co_test[0x1f].expected = "1792";
  co_test[0x20].num = 0x70;
  co_test[0x20].expected = "112";
  co_test[0x21].num = 7;
  co_test[0x21].expected = "7";
  co_test[0x22].num = 1;
  co_test[0x22].expected = "1";
  co_test[0x23].num = 0;
  co_test[0x23].expected = "0";
  co_test[0x24].num = -0x8000000000000000;
  co_test[0x24].expected = "-9223372036854775808";
  co_test[0x25].num = -0x7fffffffffffffff;
  co_test[0x25].expected = "-9223372036854775807";
  co_test[0x26].num = -0x7ffffffffffffffe;
  co_test[0x26].expected = "-9223372036854775806";
  co_test[0x27].num = -0x7fffffff00000001;
  co_test[0x27].expected = "-9223372032559808513";
  co_test[0x28].num = -0x80000000;
  co_test[0x28].expected = "-2147483648";
  co_test[0x29].num = -0x7fff000000000001;
  co_test[0x29].expected = "-9223090561878065153";
  co_test[0x2a].num = -0x7fff00000001;
  co_test[0x2a].expected = "-140733193388033";
  co_test[0x2b].num = -0x7fff0001;
  co_test[0x2b].expected = "-2147418113";
  co_test[0x2c].num = -0x8000;
  co_test[0x2c].expected = "-32768";
  co_test[0x2d].num = -0x7f00000000000001;
  co_test[0x2d].expected = "-9151314442816847873";
  co_test[0x2e].num = -0x7f000000000001;
  co_test[0x2e].expected = "-35747322042253313";
  co_test[0x2f].num = -0x7f0000000001;
  co_test[0x2f].expected = "-139637976727553";
  co_test[0x30].num = -0x7f00000001;
  co_test[0x30].expected = "-545460846593";
  co_test[0x31].num = -0x7f000001;
  co_test[0x31].expected = "-2130706433";
  co_test[0x32].num = -0x7f0001;
  co_test[0x32].expected = "-8323073";
  co_test[0x33].num = -0x7f01;
  co_test[0x33].expected = "-32513";
  co_test[0x34].num = -0x80;
  co_test[0x34].expected = "-128";
  co_test[0x35].num = -0x7000000000000001;
  co_test[0x35].expected = "-8070450532247928833";
  co_test[0x36].num = -0x700000000000001;
  co_test[0x36].expected = "-504403158265495553";
  co_test[0x37].num = -0x70000000000001;
  co_test[0x37].expected = "-31525197391593473";
  co_test[0x38].num = -0x7000000000001;
  co_test[0x38].expected = "-1970324836974593";
  co_test[0x39].num = -0x700000000001;
  co_test[0x39].expected = "-123145302310913";
  co_test[0x3a].num = -0x70000000001;
  co_test[0x3a].expected = "-7696581394433";
  co_test[0x3b].num = -0x7000000001;
  co_test[0x3b].expected = "-481036337153";
  co_test[0x3c].num = -0x700000001;
  co_test[0x3c].expected = "-30064771073";
  co_test[0x3d].num = -0x70000001;
  co_test[0x3d].expected = "-1879048193";
  co_test[0x3e].num = -0x7000001;
  co_test[0x3e].expected = "-117440513";
  co_test[0x3f].num = -0x700001;
  co_test[0x3f].expected = "-7340033";
  co_test[0x40].num = -0x70001;
  co_test[0x40].expected = "-458753";
  co_test[0x41].num = -0x7001;
  co_test[0x41].expected = "-28673";
  co_test[0x42].num = -0x701;
  co_test[0x42].expected = "-1793";
  co_test[0x43].num = -0x71;
  co_test[0x43].expected = "-113";
  co_test[0x44].num = -8;
  co_test[0x44].expected = "-8";
  co_test[0x45].num = -1;
  co_test[0x45].expected = "-1";
  lVar6 = 0x12e590;
  iVar1 = 0;
  for (uVar5 = 1; uVar5 != 0x46; uVar5 = uVar5 + 1) {
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      *(undefined1 *)(lVar6 + lVar3) = 0x58;
    }
    pcVar8 = co_test[uVar5].result;
    co_test[uVar5].result[0xff] = '\0';
    curl_msprintf(pcVar8,"%ld",co_test[uVar5].num);
    pcVar7 = co_test[uVar5].expected;
    sVar4 = strlen(pcVar7);
    iVar2 = bcmp(pcVar8,pcVar7,sVar4);
    if (iVar2 != 0) {
      printf("curl_off_t test #%.2d: Failed (Expected: %s Got: %s)\n",uVar5 & 0xffffffff,pcVar7,
             pcVar8);
      iVar1 = iVar1 + 1;
    }
    lVar6 = lVar6 + 0x110;
  }
  pcVar7 = "Some curl_mprintf() curl_off_t tests Failed!";
  if (iVar1 == 0) {
    pcVar7 = "All curl_mprintf() curl_off_t tests OK!";
  }
  puts(pcVar7);
  iVar2 = 0x7e;
  if (local_64 + local_68 + local_5c + local_60 + local_58 + local_54 + iVar1 == 0) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int test_unsigned_short_formatting(void)
{
  int i, j;
  int num_ushort_tests;
  int failed = 0;

#if (SIZEOF_SHORT == 1)

  i=1; us_test[i].num = 0xFFU; us_test[i].expected = "256";
  i++; us_test[i].num = 0xF0U; us_test[i].expected = "240";
  i++; us_test[i].num = 0x0FU; us_test[i].expected = "15";

  i++; us_test[i].num = 0xE0U; us_test[i].expected = "224";
  i++; us_test[i].num = 0x0EU; us_test[i].expected = "14";

  i++; us_test[i].num = 0xC0U; us_test[i].expected = "192";
  i++; us_test[i].num = 0x0CU; us_test[i].expected = "12";

  i++; us_test[i].num = 0x01U; us_test[i].expected = "1";
  i++; us_test[i].num = 0x00U; us_test[i].expected = "0";

  num_ushort_tests = i;

#elif (SIZEOF_SHORT == 2)

  i=1; us_test[i].num = 0xFFFFU; us_test[i].expected = "65535";
  i++; us_test[i].num = 0xFF00U; us_test[i].expected = "65280";
  i++; us_test[i].num = 0x00FFU; us_test[i].expected = "255";

  i++; us_test[i].num = 0xF000U; us_test[i].expected = "61440";
  i++; us_test[i].num = 0x0F00U; us_test[i].expected = "3840";
  i++; us_test[i].num = 0x00F0U; us_test[i].expected = "240";
  i++; us_test[i].num = 0x000FU; us_test[i].expected = "15";

  i++; us_test[i].num = 0xC000U; us_test[i].expected = "49152";
  i++; us_test[i].num = 0x0C00U; us_test[i].expected = "3072";
  i++; us_test[i].num = 0x00C0U; us_test[i].expected = "192";
  i++; us_test[i].num = 0x000CU; us_test[i].expected = "12";

  i++; us_test[i].num = 0x0001U; us_test[i].expected = "1";
  i++; us_test[i].num = 0x0000U; us_test[i].expected = "0";

  num_ushort_tests = i;

#elif (SIZEOF_SHORT == 4)

  i=1; us_test[i].num = 0xFFFFFFFFU; us_test[i].expected = "4294967295";
  i++; us_test[i].num = 0xFFFF0000U; us_test[i].expected = "4294901760";
  i++; us_test[i].num = 0x0000FFFFU; us_test[i].expected = "65535";

  i++; us_test[i].num = 0xFF000000U; us_test[i].expected = "4278190080";
  i++; us_test[i].num = 0x00FF0000U; us_test[i].expected = "16711680";
  i++; us_test[i].num = 0x0000FF00U; us_test[i].expected = "65280";
  i++; us_test[i].num = 0x000000FFU; us_test[i].expected = "255";

  i++; us_test[i].num = 0xF0000000U; us_test[i].expected = "4026531840";
  i++; us_test[i].num = 0x0F000000U; us_test[i].expected = "251658240";
  i++; us_test[i].num = 0x00F00000U; us_test[i].expected = "15728640";
  i++; us_test[i].num = 0x000F0000U; us_test[i].expected = "983040";
  i++; us_test[i].num = 0x0000F000U; us_test[i].expected = "61440";
  i++; us_test[i].num = 0x00000F00U; us_test[i].expected = "3840";
  i++; us_test[i].num = 0x000000F0U; us_test[i].expected = "240";
  i++; us_test[i].num = 0x0000000FU; us_test[i].expected = "15";

  i++; us_test[i].num = 0xC0000000U; us_test[i].expected = "3221225472";
  i++; us_test[i].num = 0x0C000000U; us_test[i].expected = "201326592";
  i++; us_test[i].num = 0x00C00000U; us_test[i].expected = "12582912";
  i++; us_test[i].num = 0x000C0000U; us_test[i].expected = "786432";
  i++; us_test[i].num = 0x0000C000U; us_test[i].expected = "49152";
  i++; us_test[i].num = 0x00000C00U; us_test[i].expected = "3072";
  i++; us_test[i].num = 0x000000C0U; us_test[i].expected = "192";
  i++; us_test[i].num = 0x0000000CU; us_test[i].expected = "12";

  i++; us_test[i].num = 0x00000001U; us_test[i].expected = "1";
  i++; us_test[i].num = 0x00000000U; us_test[i].expected = "0";

  num_ushort_tests = i;

#endif

  for(i=1; i<=num_ushort_tests; i++) {

    for(j=0; j<BUFSZ; j++)
      us_test[i].result[j] = 'X';
    us_test[i].result[BUFSZ-1] = '\0';

    (void)curl_msprintf(us_test[i].result, "%hu", us_test[i].num);

    if(memcmp(us_test[i].result,
               us_test[i].expected,
               strlen(us_test[i].expected))) {
      printf("unsigned short test #%.2d: Failed (Expected: %s Got: %s)\n",
             i, us_test[i].expected, us_test[i].result);
      failed++;
    }

  }

  if(!failed)
    printf("All curl_mprintf() unsigned short tests OK!\n");
  else
    printf("Some curl_mprintf() unsigned short tests Failed!\n");

  return failed;
}